

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PollerSelect.cpp
# Opt level: O1

void __thiscall Liby::PollerSelect::addChanel(PollerSelect *this,Channel *ch)

{
  __fd_mask *p_Var1;
  uint uVar2;
  undefined8 *puVar3;
  byte bVar4;
  
  if (ch != (Channel *)0x0) {
    uVar2 = ch->fd_;
    if (-1 < (int)uVar2) {
      if ((int)uVar2 < 0x400) {
        if (this->maxfd_ <= (int)uVar2) {
          this->maxfd_ = uVar2 + 1;
        }
        (this->super_Poller).channels_.
        super__Vector_base<Liby::Channel_*,_std::allocator<Liby::Channel_*>_>._M_impl.
        super__Vector_impl_data._M_start[uVar2] = ch;
        bVar4 = (byte)uVar2;
        if (ch->readable_ == true) {
          p_Var1 = (this->rset_).fds_bits + (uVar2 >> 6);
          *p_Var1 = *p_Var1 | 1L << (bVar4 & 0x3f);
        }
        if (ch->writable_ == true) {
          p_Var1 = (this->wset_).fds_bits + (uVar2 >> 6);
          *p_Var1 = *p_Var1 | 1L << (bVar4 & 0x3f);
        }
        p_Var1 = (this->eset_).fds_bits + (uVar2 >> 6);
        *p_Var1 = *p_Var1 | 1L << (bVar4 & 0x3f);
        return;
      }
      puVar3 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar3 = "fd >= 1024";
      __cxa_throw(puVar3,&char_const*::typeinfo,0);
    }
  }
  __assert_fail("ch && ch->get_fd() >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/PollerSelect.cpp"
                ,9,"virtual void Liby::PollerSelect::addChanel(Channel *)");
}

Assistant:

void PollerSelect::addChanel(Channel *ch) {
    assert(ch && ch->get_fd() >= 0);

    int fd = ch->get_fd();
    if (fd >= FD_SETSIZE) {
        throw "fd >= 1024";
    }

    if (fd >= maxfd_) {
        maxfd_ = fd + 1;
    }

    setChannel(fd, ch);

    if (ch->readable())
        FD_SET(fd, &rset_);
    if (ch->writable())
        FD_SET(fd, &wset_);
    FD_SET(fd, &eset_);
}